

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O2

void __thiscall
amrex::ErrorList::add(ErrorList *this,string *name,int nextra,ErrorType typ,ErrorFunc *func)

{
  long *plVar1;
  _Alloc_hider _Var2;
  long lVar3;
  ErrorType local_44;
  _Alloc_hider local_40;
  ErrorType local_34;
  
  lVar3 = (*(long *)(this + 8) - *(long *)this) * 0x20000000;
  local_44 = nextra;
  local_34 = typ;
  std::
  vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
  ::resize((vector<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>,_std::allocator<std::unique_ptr<amrex::ErrorRec,_std::default_delete<amrex::ErrorRec>_>_>_>
            *)this,lVar3 + 0x100000000 >> 0x20);
  std::
  make_unique<amrex::ErrorRec,std::__cxx11::string_const&,int&,amrex::ErrorRec::ErrorType&,amrex::ErrorRec::ErrorFunc_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,
             (int *)name,&local_44,(ErrorFunc *)&local_34);
  _Var2._M_p = local_40._M_p;
  local_40._M_p = (pointer)0x0;
  lVar3 = lVar3 >> 0x1d;
  plVar1 = *(long **)(*(long *)this + lVar3);
  *(pointer *)(*(long *)this + lVar3) = _Var2._M_p;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if ((long *)local_40._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_40._M_p + 8))();
  }
  return;
}

Assistant:

void
ErrorList::add (const std::string&         name,
                int                        nextra,
                ErrorRec::ErrorType        typ,
                const ErrorRec::ErrorFunc& func)
{
    //
    // Keep list in order of definition, append().
    //
    int n = vec.size();
    vec.resize(n+1);
    vec[n] = std::make_unique<ErrorRec>(name, nextra, typ, func);
}